

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m2v.c
# Opt level: O0

void m2v_multadd_row_from(m2v *M1,int r1,int offs,int alpha,m2v *Mt,int rt)

{
  int iVar1;
  m2v_base mVar2;
  int in_ECX;
  int in_EDX;
  int in_ESI;
  m2v *in_RDI;
  m2v *in_R8;
  int in_R9D;
  int oe;
  m2v_base m;
  int ot;
  int o1;
  int local_2c;
  int local_28;
  
  if (in_ECX != 0) {
    local_28 = m2v__get_word(in_RDI,in_ESI,in_EDX);
    local_2c = m2v__get_word(in_R8,in_R9D,in_EDX);
    iVar1 = m2v__get_bit(in_R8,in_EDX);
    mVar2 = m2v__get_mask(iVar1);
    in_R8->e[local_2c] = in_RDI->e[local_28] & (mVar2 - 1 ^ 0xffffffff) ^ in_R8->e[local_2c];
    iVar1 = m2v__get_word(in_R8,in_R9D + 1,0);
    while( true ) {
      local_28 = local_28 + 1;
      local_2c = local_2c + 1;
      if (iVar1 <= local_2c) break;
      in_R8->e[local_2c] = in_RDI->e[local_28] ^ in_R8->e[local_2c];
    }
  }
  return;
}

Assistant:

void m2v_multadd_row_from(const m2v* M1,
			int r1,
			int offs,
			int alpha,
			m2v* Mt,
			int rt)
{
	assert(M1->n_col == Mt->n_col);
	assert(0 <= r1 && r1 < M1->n_row);
	assert(0 <= rt && rt < Mt->n_row);
	if (alpha == 0)
		return;

	int o1 = get_word(M1, r1, offs);
	int ot = get_word(Mt, rt, offs);
	/* multadd first partial word */
	{
		const m2v_base m = ~(get_mask(get_bit(Mt, offs)) - 1);
		Mt->e[ot++] ^= M1->e[o1++] & m;
	}

	/* loop over remaining complete words */
	const int oe = get_word(Mt, rt + 1, 0);
	while (ot < oe) {
		Mt->e[ot++] ^= M1->e[o1++];
	}
}